

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnAtomicRmwCmpxchgExpr
          (BinaryReaderIR *this,Opcode opcode,uint32_t alignment_log2,Address offset)

{
  Result RVar1;
  Expr *local_30;
  int local_24;
  Address offset_local;
  Opcode opcode_local;
  _Head_base<0UL,_wabt::Expr_*,_false> local_18;
  
  local_24 = 1 << ((byte)alignment_log2 & 0x1f);
  offset_local = offset;
  opcode_local = opcode;
  MakeUnique<wabt::LoadStoreExpr<(wabt::ExprType)2>,wabt::Opcode&,int,unsigned_int&>
            ((wabt *)&local_30,&opcode_local,&local_24,&offset_local);
  local_18._M_head_impl = local_30;
  local_30 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_18);
  if (local_18._M_head_impl != (Expr *)0x0) {
    (*(local_18._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_30 != (Expr *)0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnAtomicRmwCmpxchgExpr(Opcode opcode,
                                              uint32_t alignment_log2,
                                              Address offset) {
  return AppendExpr(
      MakeUnique<AtomicRmwCmpxchgExpr>(opcode, 1 << alignment_log2, offset));
}